

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethercatfoe.c
# Opt level: O3

int ecx_FOEwrite(ecx_contextt *context,uint16 slave,char *filename,uint32 password,int psize,void *p
                ,int timeout)

{
  uint8 uVar1;
  int iVar2;
  size_t sVar3;
  ulong uVar4;
  uint uVar5;
  undefined6 in_register_00000032;
  bool bVar6;
  uint uVar7;
  ec_mbxbuft MbxOut;
  ec_mbxbuft MbxIn;
  uint32 local_85c;
  void *local_850;
  short local_838;
  uint8 local_836 [3];
  byte local_833;
  uint8 local_832;
  uint32 local_830;
  undefined1 local_82c [1012];
  uint8 local_438 [5];
  byte local_433;
  uint8 local_432;
  uint32 local_430;
  
  ec_clearmbx((ec_mbxbuft *)local_438);
  local_85c = 0;
  ecx_mbxreceive(context,slave,(ec_mbxbuft *)local_438,0);
  ec_clearmbx((ec_mbxbuft *)&local_838);
  sVar3 = strlen(filename);
  uVar4 = CONCAT62(in_register_00000032,slave) & 0xffffffff;
  uVar7 = context->slavelist[uVar4].mbx_l - 0xc;
  uVar5 = uVar7 & 0xffff;
  if (((uint)sVar3 & 0xffff) <= uVar5) {
    uVar7 = (uint)sVar3;
  }
  local_838 = (short)uVar7 + 6;
  local_836[0] = '\0';
  local_836[1] = '\0';
  local_836[2] = '\0';
  uVar1 = ec_nextmbxcnt(context->slavelist[uVar4].mbx_cnt);
  context->slavelist[uVar4].mbx_cnt = uVar1;
  local_833 = uVar1 << 4 | 4;
  local_832 = '\x02';
  local_830 = password;
  memcpy(local_82c,filename,(ulong)(uVar7 & 0xffff));
  iVar2 = ecx_mbxsend(context,slave,(ec_mbxbuft *)&local_838,20000);
  if (0 < iVar2) {
    bVar6 = false;
    local_850 = p;
    while( true ) {
      ec_clearmbx((ec_mbxbuft *)local_438);
      iVar2 = ecx_mbxreceive(context,slave,(ec_mbxbuft *)local_438,timeout);
      if (iVar2 < 1) break;
      if ((local_433 & 0xf) != 4) {
        return -3;
      }
      if (local_432 != '\x04') {
        if (local_432 == '\x05') {
          return -5;
        }
        if (local_432 == '\x06') {
          return iVar2;
        }
        return -3;
      }
      if (local_85c != local_430) {
        return -7;
      }
      if (context->FOEhook != (_func_int_uint16_int_int *)0x0) {
        (*context->FOEhook)(slave,local_85c,psize);
      }
      uVar7 = uVar5;
      if (psize < (int)uVar5) {
        uVar7 = psize;
      }
      if (!(bool)(uVar7 != 0 | bVar6)) {
        return iVar2;
      }
      bVar6 = (int)uVar5 <= psize && psize - uVar7 == 0;
      local_838 = (short)uVar7 + 6;
      local_836[0] = '\0';
      local_836[1] = '\0';
      local_836[2] = '\0';
      uVar1 = ec_nextmbxcnt(context->slavelist[uVar4].mbx_cnt);
      context->slavelist[uVar4].mbx_cnt = uVar1;
      local_833 = uVar1 << 4 | 4;
      local_832 = '\x03';
      local_85c = local_85c + 1;
      local_830 = local_85c;
      memcpy(local_82c,local_850,(long)(int)uVar7);
      local_850 = (void *)((long)local_850 + (long)(int)uVar7);
      iVar2 = ecx_mbxsend(context,slave,(ec_mbxbuft *)&local_838,20000);
      psize = psize - uVar7;
      if (iVar2 < 1) {
        return iVar2;
      }
    }
  }
  return iVar2;
}

Assistant:

int ecx_FOEwrite(ecx_contextt *context, uint16 slave, char *filename, uint32 password, int psize, void *p, int timeout)
{
   ec_FOEt *FOEp, *aFOEp;
   int wkc;
   int32 packetnumber, sendpacket = 0;
   uint16 fnsize, maxdata;
   int segmentdata;
   ec_mbxbuft MbxIn, MbxOut;
   uint8 cnt;
   boolean worktodo, dofinalzero;
   int tsize;

   ec_clearmbx(&MbxIn);
   /* Empty slave out mailbox if something is in. Timout set to 0 */
   wkc = ecx_mbxreceive(context, slave, (ec_mbxbuft *)&MbxIn, 0);
   ec_clearmbx(&MbxOut);
   aFOEp = (ec_FOEt *)&MbxIn;
   FOEp = (ec_FOEt *)&MbxOut;
   dofinalzero = FALSE;
   fnsize = strlen(filename);
   maxdata = context->slavelist[slave].mbx_l - 12;
   if (fnsize > maxdata)
   {
      fnsize = maxdata;
   }
   FOEp->MbxHeader.length = htoes(0x0006 + fnsize);
   FOEp->MbxHeader.address = htoes(0x0000);
   FOEp->MbxHeader.priority = 0x00;
   /* get new mailbox count value, used as session handle */
   cnt = ec_nextmbxcnt(context->slavelist[slave].mbx_cnt);
   context->slavelist[slave].mbx_cnt = cnt;
   FOEp->MbxHeader.mbxtype = ECT_MBXT_FOE + (cnt << 4); /* FoE */
   FOEp->OpCode = ECT_FOE_WRITE;
   FOEp->Password = htoel(password);
   /* copy filename in mailbox */
   memcpy(&FOEp->FileName[0], filename, fnsize);
   /* send FoE request to slave */
   wkc = ecx_mbxsend(context, slave, (ec_mbxbuft *)&MbxOut, EC_TIMEOUTTXM);
   if (wkc > 0) /* succeeded to place mailbox in slave ? */
   {
      do
      {   
         worktodo = FALSE;
         /* clean mailboxbuffer */
         ec_clearmbx(&MbxIn);
         /* read slave response */
         wkc = ecx_mbxreceive(context, slave, (ec_mbxbuft *)&MbxIn, timeout);
         if (wkc > 0) /* succeeded to read slave response ? */
         {
            /* slave response should be FoE */
            if ((aFOEp->MbxHeader.mbxtype & 0x0f) == ECT_MBXT_FOE)
            {
               switch (aFOEp->OpCode)
               {
                  case ECT_FOE_ACK:
                  {
                     packetnumber = etohl(aFOEp->PacketNumber);
                     if (packetnumber == sendpacket)
                     {
                        if (context->FOEhook)
                        {
                           context->FOEhook(slave, packetnumber, psize);
                        }
                        tsize = psize;
                        if (tsize > maxdata)
                        {
                           tsize = maxdata;
                        }
                        if(tsize || dofinalzero)
                        {
                           worktodo = TRUE; 
                           dofinalzero = FALSE;
                           segmentdata = tsize;
                           psize -= segmentdata;
                           /* if last packet was full size, add a zero size packet as final */
                           /* EOF is defined as packetsize < full packetsize */
                           if (!psize && (segmentdata == maxdata))
                           {
                              dofinalzero = TRUE;
                           }
                           FOEp->MbxHeader.length = htoes(0x0006 + segmentdata);
                           FOEp->MbxHeader.address = htoes(0x0000);
                           FOEp->MbxHeader.priority = 0x00;
                           /* get new mailbox count value */
                           cnt = ec_nextmbxcnt(context->slavelist[slave].mbx_cnt);
                           context->slavelist[slave].mbx_cnt = cnt;
                           FOEp->MbxHeader.mbxtype = ECT_MBXT_FOE + (cnt << 4); /* FoE */
                           FOEp->OpCode = ECT_FOE_DATA;
                           sendpacket++;
                           FOEp->PacketNumber = htoel(sendpacket);
                           memcpy(&FOEp->Data[0], p, segmentdata);
                           p = (uint8 *)p + segmentdata;
                           /* send FoE data to slave */
                           wkc = ecx_mbxsend(context, slave, (ec_mbxbuft *)&MbxOut, EC_TIMEOUTTXM);
                           if (wkc <= 0)
                           {   
                              worktodo = FALSE;
                           }
                        }
                     }
                     else
                     {
                        /* FoE error */
                        wkc = -EC_ERR_TYPE_FOE_PACKETNUMBER;
                     }
                     break;
                  }
                  case ECT_FOE_BUSY:
                  {
                     /* resend if data has been send before */
                     /* otherwise ignore */
                     if (sendpacket)
                     {
                        if (!psize)
                        {
                           dofinalzero = TRUE;
                        }
                        psize += segmentdata;
                        p = (uint8 *)p - segmentdata;
                        --sendpacket;
                     }
                     break;
                  }
                  case ECT_FOE_ERROR:
                  {
                     /* FoE error */
                     wkc = -EC_ERR_TYPE_FOE_ERROR;
                     break;
                  }
                  default:
                  {
                     /* unexpected mailbox received */
                     wkc = -EC_ERR_TYPE_PACKET_ERROR;
                  }
               }
            }
            else
            {
               /* unexpected mailbox received */
               wkc = -EC_ERR_TYPE_PACKET_ERROR;
            }
         }
      } while (worktodo);   
   }
   
   return wkc;
}